

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CTPNStmCompBase::gen_code(CTPNStmCompBase *this,int param_1,int param_2)

{
  CTPNStm *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  CTcTokenizer *pCVar4;
  long lVar5;
  CTcPrsSymtab *symtab;
  
  symtab = CTcCodeStream::set_local_frame(G_cs,this->symtab_);
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar4 = G_tok;
  for (pCVar1 = this->first_stm_; G_tok = pCVar4, pCVar1 != (CTPNStm *)0x0;
      pCVar1 = (pCVar1->super_CTPNStmBase).next_stm_) {
    uVar2 = *(undefined4 *)((long)&(pCVar1->super_CTPNStmBase).file_ + 4);
    lVar5 = (pCVar1->super_CTPNStmBase).linenum_;
    uVar3 = *(undefined4 *)((long)&(pCVar1->super_CTPNStmBase).linenum_ + 4);
    *(undefined4 *)&pCVar4->last_desc_ = *(undefined4 *)&(pCVar1->super_CTPNStmBase).file_;
    *(undefined4 *)((long)&pCVar4->last_desc_ + 4) = uVar2;
    *(int *)&pCVar4->last_linenum_ = (int)lVar5;
    *(undefined4 *)((long)&pCVar4->last_linenum_ + 4) = uVar3;
    (**(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
              (pCVar1,1,1);
    pCVar4 = G_tok;
  }
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this,this->end_desc_,this->end_linenum_);
  pCVar4 = G_tok;
  if ((this->symtab_ != (CTcPrsSymtab *)0x0) && ((this->field_0x40 & 1) != 0)) {
    lVar5 = (this->super_CTPNStm).super_CTPNStmBase.linenum_;
    G_tok->last_desc_ = (this->super_CTPNStm).super_CTPNStmBase.file_;
    pCVar4->last_linenum_ = lVar5;
  }
  CTcCodeStream::set_local_frame(G_cs,symtab);
  return;
}

Assistant:

void CTPNStmCompBase::gen_code(int, int)
{
    CTPNStm *cur;
    CTcPrsSymtab *old_frame;

    /* set my local scope symbol frame, if necessary */
    old_frame = G_cs->set_local_frame(symtab_);

    /* set the code location for the start of the group */
    add_debug_line_rec();

    /* 
     *   iterate through our statements and generate code for each in
     *   sequence 
     */
    for (cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm())
    {
        /* 
         *   set this statement's source line location to be the current
         *   location for error reporting 
         */
        G_tok->set_line_info(cur->get_source_desc(),
                             cur->get_source_linenum());

        /* 
         *   Generate code for the statement.  Note that we generate in
         *   the scope of the enclosing symbol table, because we never
         *   resolve symbols to local scope during code generation - local
         *   scope symbols must be resolved during parsing, because these
         *   symbols must always be declared before first being used 
         *   
         *   We have no use for the results of any expressions, so discard
         *   = true; we don't care about the form of any logical operator
         *   results, so use the looser "for condition" rules 
         */
        cur->gen_code(TRUE, TRUE);
    }

    /* set the source location for the end of the group */
    add_debug_line_rec(end_desc_, end_linenum_);

    /* check for unreferenced local variables */
    if (symtab_ != 0 && has_own_scope_)
    {
        /* 
         *   set our line information to be current again, so that any
         *   unreferenced local errors are reported at the start of the
         *   compound statement 
         */
        G_tok->set_line_info(get_source_desc(),
                             get_source_linenum());
    }

    /* restore the enclosing local frame */
    old_frame = G_cs->set_local_frame(old_frame);
}